

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cpp
# Opt level: O3

int tracy::dwarf_lookup_pc
              (backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
              backtrace_full_callback callback,backtrace_error_callback error_callback,void *data,
              int *found)

{
  ulong *puVar1;
  char *pcVar2;
  function_vector *vec;
  function *function;
  unit *u;
  ulong uVar3;
  dwarf_data *pdVar4;
  function_addrs *pfVar5;
  bool bVar6;
  uint64_t *puVar7;
  long lVar8;
  syminfo error_callback_00;
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  size_t sVar12;
  uint16_t uVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  uint uVar17;
  void *pvVar18;
  unit_addrs *puVar19;
  unit_addrs *puVar20;
  unit_addrs *puVar21;
  void *pvVar22;
  size_t sVar23;
  size_t sVar24;
  char *pcVar25;
  fileline p_Var26;
  unit *puVar27;
  undefined8 *puVar28;
  syminfo p_Var29;
  ulong uVar30;
  int64_t iVar31;
  uint64_t uVar32;
  backtrace_state *pbVar33;
  function_vector *pfVar34;
  undefined4 *puVar35;
  int iVar36;
  unit **ppuVar37;
  backtrace_state *pbVar38;
  long lVar39;
  code *data_00;
  uintptr_t uVar40;
  backtrace_syminfo_callback p_Var41;
  backtrace_error_callback error_callback_01;
  backtrace_state *pbVar42;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **error_callback_02;
  uint uVar43;
  char *p_1;
  function_addrs *pfVar44;
  uint uVar45;
  char *p;
  backtrace_state *pbVar46;
  long lVar47;
  line_header *hdr;
  char *pcVar48;
  long lVar49;
  dwarf_data *hdr_00;
  long lVar50;
  line **pplVar51;
  unit_addrs *puVar52;
  function_addrs *pfVar53;
  ulong local_260;
  dwarf_data *local_258;
  backtrace_state *local_250;
  size_t *local_240;
  uintptr_t pc_local;
  backtrace_state *local_220;
  undefined1 local_218 [16];
  backtrace_state *local_208;
  fileline p_Stack_200;
  int local_1f8;
  syminfo p_Stack_1f0;
  backtrace_state *local_1e8;
  int iStack_1e0;
  int lineno;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  syminfo p_Stack_1b0;
  undefined1 local_1a8 [16];
  backtrace_freelist_struct *local_198;
  backtrace_state *local_190;
  function_vector lvec;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  line **local_100;
  char *filename;
  uchar *local_f0;
  dwarf_data *local_e8;
  dwarf_data *local_e0;
  int local_d8;
  backtrace_error_callback local_d0;
  void *local_c8;
  int local_c0;
  
  *found = 1;
  if ((pc != 0xffffffffffffffff && ddata->addrs_count != 0) &&
     (pc_local = pc,
     pvVar18 = bsearch(&pc_local,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search),
     pvVar18 != (void *)0x0)) {
    puVar19 = (unit_addrs *)((long)pvVar18 - 0x30);
    do {
      puVar20 = puVar19 + 1;
      puVar52 = puVar19 + 3;
      puVar19 = puVar20;
    } while (pc_local == puVar52->low);
    do {
      puVar19 = puVar20 + 1;
      if (pc_local < puVar20[1].high) {
        puVar27 = puVar20[1].u;
        pplVar51 = &puVar27->lines;
        pbVar46 = (backtrace_state *)puVar27->lines;
        if ((puVar19 <= ddata->addrs) || (pc_local < puVar20->low)) goto LAB_0038a5df;
        ppuVar37 = &puVar20->u;
        puVar52 = puVar19;
        goto LAB_0038a57c;
      }
    } while ((puVar19 != ddata->addrs) &&
            (puVar7 = &puVar20->low, puVar19 = puVar20 + 1, puVar20 = puVar20 + -1,
            puVar19->low <= *puVar7));
  }
  goto LAB_0038a7ec;
  while( true ) {
    if (state->threaded != 0) {
      pbVar46 = (backtrace_state *)*pplVar51;
    }
    puVar19 = puVar52;
    if (pbVar46 != (backtrace_state *)0xffffffffffffffff) break;
    puVar52 = (unit_addrs *)(ppuVar37 + -2);
    puVar27 = *ppuVar37;
    pplVar51 = &puVar27->lines;
    pbVar46 = (backtrace_state *)puVar27->lines;
    puVar19 = puVar21;
    if (puVar52 <= ddata->addrs) break;
    puVar1 = (ulong *)(ppuVar37 + -5);
    puVar20 = puVar21 + -1;
    ppuVar37 = ppuVar37 + -3;
    puVar19 = puVar52;
    puVar52 = puVar21;
    if (pc_local < *puVar1) break;
LAB_0038a57c:
    puVar21 = puVar20;
    if (ppuVar37[-1] <= pc_local) {
      puVar19 = (unit_addrs *)(ppuVar37 + 1);
      break;
    }
  }
LAB_0038a5df:
  if (state->threaded != 0) {
    pbVar46 = (backtrace_state *)*pplVar51;
  }
  if (pbVar46 == (backtrace_state *)0xffffffffffffffff) {
LAB_0038a722:
    pcVar25 = (char *)0x0;
  }
  else {
    if (pbVar46 == (backtrace_state *)0x0) {
      u = puVar19->u;
      local_128 = (undefined1  [16])0x0;
      local_118._0_16_ = (undefined1  [16])0x0;
      _lineno = (undefined1  [16])0x0;
      local_1c8 = (undefined1  [16])0x0;
      _local_1b8 = (undefined1  [16])0x0;
      local_1a8 = (undefined1  [16])0x0;
      local_198 = (backtrace_freelist_struct *)0x0;
      uVar30 = u->lineoff;
      uVar3 = (ddata->dwarf_sections).size[1];
      p_Var26 = (fileline)(uVar3 - uVar30);
      local_100 = pplVar51;
      if (uVar3 < uVar30 || p_Var26 == (fileline)0x0) {
        pbVar46 = (backtrace_state *)data;
        (*error_callback)(data,"unit line offset out of range",0);
LAB_0038ab90:
        hdr = (line_header *)local_128;
        local_118._0_8_ = (uchar *)(local_118._0_8_ + local_128._8_8_);
        local_128._8_8_ = 0;
        pvVar18 = data;
        backtrace_vector_release(pbVar46,(backtrace_vector *)hdr,error_callback,data);
        free_line_header((backtrace_state *)&lineno,hdr,error_callback_01,pvVar18);
        pbVar46 = (backtrace_state *)0xffffffffffffffff;
        bVar6 = true;
        pfVar44 = (function_addrs *)0x0;
        local_258 = (dwarf_data *)0x0;
        pbVar42 = (backtrace_state *)0x0;
      }
      else {
        local_218._0_8_ = ".debug_line";
        local_218._8_8_ = (ddata->dwarf_sections).data[1];
        local_208 = (backtrace_state *)(local_218._8_8_ + uVar30);
        local_1f8 = ddata->is_bigendian;
        iStack_1e0 = 0;
        p_Stack_200 = p_Var26;
        p_Stack_1f0 = (syminfo)error_callback;
        local_1e8 = (backtrace_state *)data;
        uVar15 = read_uint32((dwarf_buf *)local_218);
        if (uVar15 == 0xffffffff) {
          p_Stack_200 = (fileline)read_uint64((dwarf_buf *)local_218);
        }
        else {
          p_Stack_200 = (fileline)(ulong)uVar15;
        }
        uVar13 = read_uint16((dwarf_buf *)local_218);
        auVar10 = _lineno;
        pbVar46 = local_208;
        lineno = CONCAT22(0,uVar13);
        if ((ushort)(uVar13 - 6) < 0xfffc) {
          pcVar25 = "unsupported line number version";
LAB_0038a97f:
          pcVar48 = (char *)local_218._0_8_;
          snprintf((char *)&filename,200,"%s in %s at %d");
          p_Var41 = (backtrace_syminfo_callback)0xffffffff;
LAB_0038a9a6:
          pbVar46 = local_1e8;
          (*p_Stack_1f0)(local_1e8,(uintptr_t)&filename,p_Var41,(backtrace_error_callback)pcVar25,
                         pcVar48);
          goto LAB_0038ab90;
        }
        if (uVar13 == 5) {
          iVar14 = advance((dwarf_buf *)local_218,1);
          pbVar42 = local_208;
          uVar45 = 0;
          if (iVar14 != 0) {
            uVar45 = (uint)*(byte *)&pbVar46->filename;
          }
          uStack_1d4 = uVar45;
          iVar14 = advance((dwarf_buf *)local_218,1);
          if ((iVar14 != 0) && (*(uchar *)&pbVar42->filename != '\0')) {
            pcVar25 = "non-zero segment_selector_size not supported";
            goto LAB_0038a97f;
          }
        }
        else {
          _uStack_1d0 = auVar10._8_8_;
          uStack_1d4 = u->addrsize;
        }
        if (uVar15 == 0xffffffff) {
          lvec.count = read_uint64((dwarf_buf *)local_218);
        }
        else {
          uVar15 = read_uint32((dwarf_buf *)local_218);
          lvec.count = (size_t)uVar15;
        }
        iVar14 = iStack_1e0;
        pbVar42 = local_1e8;
        error_callback_00 = p_Stack_1f0;
        pbVar46 = (backtrace_state *)local_218;
        lvec.vec.size = local_218._8_8_;
        lvec.vec.base = (void *)local_218._0_8_;
        lvec.vec.alc = (size_t)local_208;
        iVar16 = advance((dwarf_buf *)pbVar46,lvec.count);
        if (iVar16 == 0) goto LAB_0038ab90;
        sVar12 = lvec.vec.alc;
        iVar16 = advance((dwarf_buf *)&lvec,1);
        auVar10 = _lineno;
        uVar45 = 0;
        if (iVar16 != 0) {
          uVar45 = (uint)*(byte *)sVar12;
        }
        uStack_1d0 = uVar45;
        auVar9 = _lineno;
        auVar11 = _lineno;
        uStack_1cc = 1;
        lineno = auVar10._0_4_;
        bVar6 = 3 < lineno;
        _lineno = auVar9;
        if (bVar6) {
          sVar12 = lvec.vec.alc;
          _lineno = auVar11;
          iVar16 = advance((dwarf_buf *)&lvec,1);
          uStack_1cc = 0;
          if (iVar16 != 0) {
            uStack_1cc = (uint)*(byte *)sVar12;
          }
        }
        advance((dwarf_buf *)&lvec,1);
        sVar12 = lvec.vec.alc;
        iVar16 = advance((dwarf_buf *)&lvec,1);
        uVar45 = 0;
        iVar36 = 0;
        if (iVar16 != 0) {
          iVar36 = (int)*(char *)sVar12;
        }
        local_1c8._0_4_ = iVar36;
        sVar12 = lvec.vec.alc;
        iVar16 = advance((dwarf_buf *)&lvec,1);
        if (iVar16 != 0) {
          uVar45 = (uint)*(byte *)sVar12;
        }
        local_1c8._4_4_ = uVar45;
        sVar12 = lvec.vec.alc;
        iVar16 = advance((dwarf_buf *)&lvec,1);
        uVar45 = 0;
        if (iVar16 != 0) {
          uVar45 = (uint)*(byte *)sVar12;
        }
        local_1c8._8_4_ = uVar45;
        pbVar46 = (backtrace_state *)&lvec;
        local_1b8 = (undefined1  [8])lvec.vec.alc;
        iVar16 = advance((dwarf_buf *)pbVar46,(ulong)(uVar45 - 1));
        if (iVar16 == 0) goto LAB_0038ab90;
        if (lineno < 5) {
          p_Stack_1b0 = (syminfo)0x0;
          pcVar25 = (char *)lvec.vec.alc;
          lVar47 = 1;
          if (0 < (long)lvec.count) {
            pbVar38 = (backtrace_state *)(lvec.count + lvec.vec.alc);
            lVar47 = 0;
            pbVar33 = (backtrace_state *)lvec.vec.alc;
            do {
              if (*(char *)&pbVar33->filename == '\0') break;
              pbVar46 = pbVar33;
              sVar23 = strnlen((char *)pbVar33,(long)pbVar38 - (long)pbVar33);
              pbVar33 = (backtrace_state *)((long)&pbVar33->filename + sVar23 + 1);
              lVar47 = lVar47 + 1;
              p_Stack_1b0 = (syminfo)lVar47;
            } while (pbVar33 < pbVar38);
            lVar47 = lVar47 + 1;
          }
          p_Stack_1b0 = (syminfo)lVar47;
          puVar28 = (undefined8 *)
                    backtrace_alloc(pbVar46,lVar47 << 3,(backtrace_error_callback)error_callback_00,
                                    pbVar42);
          local_1a8._0_8_ = puVar28;
          if (puVar28 != (undefined8 *)0x0) {
            *puVar28 = u->comp_dir;
            if (*pcVar25 != '\0') {
              lVar47 = 8;
              do {
                if (iVar14 != 0) goto LAB_0038ab90;
                sVar23 = strnlen(pcVar25,lvec.count);
                pbVar46 = (backtrace_state *)&lvec;
                iVar16 = advance((dwarf_buf *)pbVar46,sVar23 + 1);
                if (iVar16 == 0) {
                  pcVar25 = (char *)0x0;
                }
                *(char **)(local_1a8._0_8_ + lVar47) = pcVar25;
                if (*(long *)(local_1a8._0_8_ + lVar47) == 0) goto LAB_0038ab90;
                lVar47 = lVar47 + 8;
                pcVar25 = (char *)lvec.vec.alc;
              } while (*(char *)lvec.vec.alc != '\0');
            }
            pbVar46 = (backtrace_state *)&lvec;
            lVar47 = 1;
            iVar16 = advance((dwarf_buf *)pbVar46,1);
            if (iVar16 != 0) {
              local_1a8._8_8_ = 0;
              pbVar33 = (backtrace_state *)lvec.vec.alc;
              if (0 < (long)lvec.count) {
                pcVar48 = (char *)(lvec.count + lvec.vec.alc);
                lVar47 = 0;
                pcVar25 = (char *)lvec.vec.alc;
                do {
                  if (*pcVar25 == '\0') break;
                  sVar23 = strnlen(pcVar25,(long)pcVar48 - (long)pcVar25);
                  lVar39 = 1;
                  lVar49 = 1;
                  if (pcVar25[sVar23 + 1] < '\0') {
                    lVar50 = 1;
                    do {
                      lVar49 = lVar50 + 1;
                      lVar8 = lVar50 + sVar23 + 1;
                      lVar50 = lVar49;
                    } while (pcVar25[lVar8] < '\0');
                  }
                  if (pcVar25[lVar49 + sVar23 + 1] < '\0') {
                    lVar50 = 1;
                    do {
                      lVar39 = lVar50 + 1;
                      lVar8 = lVar50 + sVar23 + lVar49 + 1;
                      lVar50 = lVar39;
                    } while (pcVar25[lVar8] < '\0');
                  }
                  lVar50 = lVar49 + sVar23 + 1;
                  pbVar46 = (backtrace_state *)0x1;
                  if (pcVar25[lVar39 + lVar50] < '\0') {
                    pbVar38 = (backtrace_state *)0x1;
                    do {
                      pbVar46 = (backtrace_state *)((long)&pbVar38->filename + 1);
                      pcVar2 = pcVar25 + sVar23 + lVar49 + lVar39 + 1 + (long)pbVar38;
                      pbVar38 = pbVar46;
                    } while (*pcVar2 < '\0');
                  }
                  pcVar25 = pcVar25 + lVar39 + lVar50 + (long)pbVar46;
                  lVar47 = lVar47 + 1;
                  local_1a8._8_8_ = lVar47;
                } while (pcVar25 < pcVar48);
                lVar47 = lVar47 + 1;
              }
              local_1a8._8_8_ = lVar47;
              local_198 = (backtrace_freelist_struct *)
                          backtrace_alloc(pbVar46,lVar47 << 3,
                                          (backtrace_error_callback)error_callback_00,pbVar42);
              if (local_198 != (backtrace_freelist_struct *)0x0) {
                *(char **)local_198 = u->filename;
                if (*(char *)pbVar33 != '\0') {
                  lVar47 = 8;
                  do {
                    if (iVar14 != 0) goto LAB_0038ab90;
                    sVar23 = strnlen((char *)pbVar33,lvec.count);
                    pbVar46 = (backtrace_state *)&lvec;
                    iVar16 = advance((dwarf_buf *)pbVar46,sVar23 + 1);
                    if (iVar16 == 0) goto LAB_0038ab90;
                    p_Var29 = (syminfo)read_uleb128((dwarf_buf *)&lvec);
                    pbVar38 = pbVar33;
                    if (*(char *)&pbVar33->filename != '/') {
                      if (p_Stack_1b0 <= p_Var29) {
                        pcVar25 = "invalid directory index in line number program header";
                        pvVar18 = lvec.vec.base;
                        snprintf((char *)&filename,200,"%s in %s at %d");
                        (*error_callback_00)
                                  (pbVar42,(uintptr_t)&filename,(backtrace_syminfo_callback)0x0,
                                   (backtrace_error_callback)pcVar25,pvVar18);
                        pbVar46 = pbVar42;
                        goto LAB_0038ab90;
                      }
                      pcVar25 = *(char **)(local_1a8._0_8_ + p_Var29 * 8);
                      if (pcVar25 != (char *)0x0) {
                        sVar23 = strlen(pcVar25);
                        pbVar46 = pbVar33;
                        sVar24 = strlen((char *)pbVar33);
                        pbVar38 = (backtrace_state *)
                                  backtrace_alloc(pbVar46,sVar23 + sVar24 + 2,
                                                  (backtrace_error_callback)error_callback_00,
                                                  pbVar42);
                        if (pbVar38 == (backtrace_state *)0x0) goto LAB_0038ab90;
                        memcpy(pbVar38,pcVar25,sVar23);
                        *(char *)((long)&pbVar38->filename + sVar23) = '/';
                        memcpy((char *)((long)&pbVar38->filename + sVar23 + 1),pbVar33,sVar24 + 1);
                      }
                    }
                    *(backtrace_state **)(local_198 + lVar47) = pbVar38;
                    pbVar46 = (backtrace_state *)&lvec;
                    read_uleb128((dwarf_buf *)pbVar46);
                    read_uleb128((dwarf_buf *)pbVar46);
                    lVar47 = lVar47 + 8;
                    pbVar33 = (backtrace_state *)lvec.vec.alc;
                  } while (*(char *)lvec.vec.alc != '\0');
                }
                goto LAB_0038b0a5;
              }
            }
          }
          goto LAB_0038ab90;
        }
        pbVar46 = state;
        iVar16 = read_line_header_format_entries
                           (state,ddata,u,(dwarf_buf *)&lvec,(line_header *)&lineno,
                            (size_t *)(local_1b8 + 8),(char ***)local_1a8);
        if ((iVar16 == 0) ||
           (pbVar46 = state,
           iVar16 = read_line_header_format_entries
                              (state,ddata,u,(dwarf_buf *)&lvec,(line_header *)&lineno,
                               (size_t *)(local_1a8 + 8),(char ***)&local_198), iVar16 == 0))
        goto LAB_0038ab90;
LAB_0038b0a5:
        if (iVar14 != 0) goto LAB_0038ab90;
        if ((ulong)local_1a8._8_8_ < 2) {
          local_250 = (backtrace_state *)0x71872f;
        }
        else {
          local_250 = *(backtrace_state **)(local_198 + 8);
        }
        local_190 = local_250;
        if (p_Stack_200 == (fileline)0x0) goto LAB_0038ab90;
        uVar45 = 1;
        local_258 = (dwarf_data *)0x0;
        local_260 = 0;
        do {
          pbVar46 = local_208;
          iVar14 = advance((dwarf_buf *)local_218,1);
          if (iVar14 == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (uint)*(byte *)&pbVar46->filename;
          }
          if ((uint)local_1c8._8_4_ <= uVar17) {
            uVar43 = (uVar17 - local_1c8._8_4_) / (uint)local_1c8._4_4_ + (int)local_260;
            local_260 = (ulong)uVar43 % (ulong)uStack_1cc;
            local_258 = (dwarf_data *)
                        ((long)local_258 + (ulong)(uStack_1d0 * uVar43) / (ulong)uStack_1cc);
            uVar45 = uVar45 + local_1c8._0_4_ + (uVar17 - local_1c8._8_4_) % (uint)local_1c8._4_4_;
LAB_0038b1c4:
            add_line(state,ddata,(uintptr_t)local_258,(char *)local_250,uVar45,
                     (backtrace_error_callback)p_Stack_1f0,local_1e8,(line_vector *)local_128);
            goto switchD_0038b15a_caseD_6;
          }
          switch((ulong)uVar17) {
          case 0:
            uVar32 = read_uleb128((dwarf_buf *)local_218);
            local_220 = local_208;
            iVar14 = advance((dwarf_buf *)local_218,1);
            pbVar42 = local_208;
            if (iVar14 == 0) {
switchD_0038b301_default:
              pbVar46 = (backtrace_state *)local_218;
              iVar14 = advance((dwarf_buf *)pbVar46,uVar32 - 1);
              if (iVar14 == 0) goto LAB_0038ab90;
            }
            else {
              switch(*(byte *)&local_220->filename) {
              case 1:
                local_260 = 0;
                uVar45 = (uint)*(byte *)&local_220->filename;
                local_250 = local_190;
                local_258 = (dwarf_data *)0x0;
                break;
              case 2:
                local_258 = (dwarf_data *)read_address((dwarf_buf *)local_218,uStack_1d4);
                break;
              case 3:
                sVar23 = strnlen((char *)local_208,(size_t)p_Stack_200);
                pbVar46 = (backtrace_state *)local_218;
                iVar14 = advance((dwarf_buf *)pbVar46,sVar23 + 1);
                local_250 = pbVar42;
                if ((pbVar42 == (backtrace_state *)0x0) || (iVar14 == 0)) goto LAB_0038ab90;
                uVar32 = read_uleb128((dwarf_buf *)local_218);
                read_uleb128((dwarf_buf *)local_218);
                read_uleb128((dwarf_buf *)local_218);
                if (*(uchar *)&pbVar42->filename != '/') {
                  if (p_Stack_1b0 <= (syminfo)(uVar32 & 0xffffffff)) {
                    pbVar46 = (backtrace_state *)local_218;
                    dwarf_buf_error((dwarf_buf *)pbVar46,
                                    "invalid directory index in line number program",0);
                    goto LAB_0038ab90;
                  }
                  pcVar25 = *(char **)(local_1a8._0_8_ + (syminfo)(uVar32 & 0xffffffff) * 8);
                  pbVar33 = (backtrace_state *)strlen(pcVar25);
                  pbVar46 = pbVar42;
                  sVar23 = strlen((char *)pbVar42);
                  local_220 = pbVar33;
                  local_250 = (backtrace_state *)
                              backtrace_alloc(pbVar46,(size_t)((long)&pbVar33->filename + sVar23 + 2
                                                              ),
                                              (backtrace_error_callback)p_Stack_1f0,local_1e8);
                  if (local_250 == (backtrace_state *)0x0) goto LAB_0038ab90;
                  memcpy(local_250,pcVar25,(size_t)local_220);
                  *(uchar *)((long)&local_220->filename + (long)&local_250->filename) = '/';
                  memcpy((uchar *)((long)&local_220->filename +
                                  (long)((long)&local_250->filename + 1)),pbVar42,sVar23 + 1);
                }
                break;
              case 4:
                read_uleb128((dwarf_buf *)local_218);
                break;
              default:
                goto switchD_0038b301_default;
              }
            }
            break;
          case 1:
            goto LAB_0038b1c4;
          case 2:
            uVar32 = read_uleb128((dwarf_buf *)local_218);
            uVar30 = ((ulong)uStack_1d0 * (uVar32 + local_260)) / (ulong)uStack_1cc;
            local_260 = (uVar32 + local_260) % (ulong)uStack_1cc;
            goto LAB_0038b26b;
          case 3:
            iVar31 = read_sleb128((dwarf_buf *)local_218);
            uVar45 = uVar45 + (int)iVar31;
            break;
          case 4:
            uVar32 = read_uleb128((dwarf_buf *)local_218);
            if ((ulong)local_1a8._8_8_ <= uVar32) {
              pcVar25 = "invalid file number in line number program";
              pcVar48 = (char *)local_218._0_8_;
              snprintf((char *)&filename,200,"%s in %s at %d");
              p_Var41 = (backtrace_syminfo_callback)0x0;
              goto LAB_0038a9a6;
            }
            local_250 = *(backtrace_state **)(local_198 + uVar32 * 8);
            break;
          case 5:
          case 0xc:
            read_uleb128((dwarf_buf *)local_218);
            break;
          case 6:
          case 7:
          case 10:
          case 0xb:
            break;
          case 8:
            uVar17 = (0xff - local_1c8._8_4_) / (uint)local_1c8._4_4_ + (int)local_260;
            uVar30 = (ulong)(uStack_1d0 * uVar17) / (ulong)uStack_1cc;
            local_260 = (ulong)uVar17 % (ulong)uStack_1cc;
LAB_0038b26b:
            local_258 = (dwarf_data *)((long)local_258 + uVar30);
            break;
          case 9:
            uVar13 = read_uint16((dwarf_buf *)local_218);
            local_258 = (dwarf_data *)((long)local_258 + (ulong)uVar13);
            local_260 = 0;
            break;
          default:
            uVar43 = (uint)*(byte *)((long)local_1b8 + ((ulong)uVar17 - 1));
            if (*(byte *)((long)local_1b8 + ((ulong)uVar17 - 1)) != 0) {
              do {
                read_uleb128((dwarf_buf *)local_218);
                uVar43 = uVar43 - 1;
              } while (uVar43 != 0);
            }
          }
switchD_0038b15a_caseD_6:
          pbVar46 = (backtrace_state *)local_218;
        } while (p_Stack_200 != (fileline)0x0);
        if (((iStack_1e0 != 0) || ((uchar *)local_118._8_8_ == (uchar *)0x0)) ||
           (puVar28 = (undefined8 *)
                      backtrace_vector_grow
                                (pbVar46,0x18,error_callback,data,(backtrace_vector *)local_128),
           puVar28 == (undefined8 *)0x0)) goto LAB_0038ab90;
        *puVar28 = 0xffffffffffffffff;
        *(undefined1 (*) [16])(puVar28 + 1) = (undefined1  [16])0x0;
        iVar14 = backtrace_vector_release(pbVar46,(backtrace_vector *)local_128,error_callback,data)
        ;
        if (iVar14 == 0) goto LAB_0038ab90;
        pbVar46 = (backtrace_state *)local_128._0_8_;
        local_220 = (backtrace_state *)local_118._8_8_;
        pbVar42 = (backtrace_state *)local_128._0_8_;
        backtrace_qsort((void *)local_128._0_8_,local_118._8_8_,0x18,line_compare);
        iVar14 = state->threaded;
        vec = &ddata->fvec;
        pfVar34 = (function_vector *)0x0;
        if (iVar14 == 0) {
          pfVar34 = vec;
        }
        pdVar4 = (dwarf_data *)puVar19->u;
        local_190 = (backtrace_state *)CONCAT44(local_190._4_4_,iVar14);
        local_250 = (backtrace_state *)vec;
        local_240 = &pfVar34->count;
        if (iVar14 != 0) {
          local_240 = &lvec.count;
          lvec.vec.alc = 0;
          lvec.count = 0;
          lvec.vec.base = (void *)0x0;
          lvec.vec.size = 0;
          local_250 = (backtrace_state *)&lvec;
        }
        error_callback_02 = &filename;
        filename = ".debug_info";
        local_f0 = (ddata->dwarf_sections).data[0];
        local_e8 = pdVar4->next;
        local_e0 = pdVar4->altlink;
        local_d8 = ddata->is_bigendian;
        local_c0 = 0;
        local_258 = (dwarf_data *)0x0;
        data_00 = (code *)pdVar4;
        hdr_00 = pdVar4;
        local_d0 = error_callback;
        local_c8 = data;
        do {
          if (local_e0 == (dwarf_data *)0x0) {
            pfVar44 = (function_addrs *)0x0;
            local_258 = (dwarf_data *)0x0;
            if (*local_240 == 0) goto LAB_0038b89d;
            hdr_00 = (dwarf_data *)0x18;
            puVar35 = (undefined4 *)
                      backtrace_vector_grow
                                (pbVar42,0x18,error_callback,data,(backtrace_vector *)local_250);
            pfVar44 = (function_addrs *)0x0;
            data_00 = (code *)0x0;
            local_258 = (dwarf_data *)0x0;
            error_callback_02 = extraout_RDX_00;
            if (puVar35 == (undefined4 *)0x0) goto LAB_0038b89d;
            *puVar35 = 0xffffffff;
            puVar35[1] = 0xffffffff;
            puVar35[2] = 0xffffffff;
            puVar35[3] = 0xffffffff;
            *(undefined8 *)(puVar35 + 4) = 0;
            pdVar4 = (dwarf_data *)*local_240;
            if ((int)local_190 == 0) {
              hdr_00 = (dwarf_data *)vec;
              iVar14 = backtrace_vector_release(pbVar42,&vec->vec,error_callback,data);
              pfVar44 = (function_addrs *)0x0;
              data_00 = (code *)0x0;
              local_258 = (dwarf_data *)0x0;
              error_callback_02 = extraout_RDX_01;
              if (iVar14 == 0) goto LAB_0038b89d;
              pfVar5 = (function_addrs *)(vec->vec).base;
              (vec->vec).base = (void *)0x0;
              (vec->vec).size = 0;
              (ddata->fvec).vec.alc = 0;
              pfVar44 = (function_addrs *)0x0;
              local_258 = (dwarf_data *)0x0;
              if (pfVar5 == (function_addrs *)0x0) goto LAB_0038b89d;
              pfVar34->count = 0;
              pfVar44 = pfVar5;
            }
            else {
              hdr_00 = (dwarf_data *)&lvec;
              iVar14 = backtrace_vector_release
                                 (pbVar42,(backtrace_vector *)hdr_00,error_callback,data);
              pfVar44 = (function_addrs *)0x0;
              data_00 = (code *)0x0;
              local_258 = (dwarf_data *)0x0;
              error_callback_02 = extraout_RDX_02;
              if (iVar14 == 0) goto LAB_0038b89d;
              pfVar44 = (function_addrs *)((backtrace_vector *)&local_250->filename)->base;
            }
            data_00 = function_addrs_compare;
            hdr_00 = pdVar4;
            backtrace_qsort(pfVar44,(size_t)pdVar4,0x18,function_addrs_compare);
            error_callback_02 = extraout_RDX_03;
            local_258 = pdVar4;
            goto LAB_0038b89d;
          }
          data_00 = (code *)0x0;
          hdr_00 = ddata;
          pbVar42 = state;
          iVar14 = read_function_entry(state,ddata,(unit *)pdVar4,0,(dwarf_buf *)&filename,
                                       (line_header *)&lineno,error_callback,data,
                                       (function_vector *)local_250,(function_vector *)local_250);
          error_callback_02 = extraout_RDX;
        } while (iVar14 != 0);
        pfVar44 = (function_addrs *)0x0;
LAB_0038b89d:
        free_line_header((backtrace_state *)&lineno,(line_header *)hdr_00,
                         (backtrace_error_callback)error_callback_02,data_00);
        bVar6 = false;
        pbVar42 = local_220;
      }
      puVar27->lines_count = (size_t)pbVar42;
      puVar27->function_addrs = pfVar44;
      puVar27->function_addrs_count = (size_t)local_258;
      *local_100 = (line *)pbVar46;
      if (pbVar46 == (backtrace_state *)0xffffffffffffffff) {
        if (!bVar6) {
          iVar14 = dwarf_lookup_pc(state,ddata,pc_local,callback,error_callback,data,found);
          return iVar14;
        }
        goto LAB_0038a722;
      }
    }
    pvVar18 = bsearch(&pc_local,pbVar46,puVar19->u->lines_count,0x18,line_search);
    puVar27 = puVar19->u;
    if (pvVar18 != (void *)0x0) {
      if (puVar27->function_addrs_count != 0) {
        pvVar22 = bsearch(&pc_local,puVar27->function_addrs,puVar27->function_addrs_count,0x18,
                          function_addrs_search);
        if (pvVar22 == (void *)0x0) {
          iVar14 = (*callback)(data,pc_local,0,*(char **)((long)pvVar18 + 8),
                               *(int *)((long)pvVar18 + 0x10),(char *)0x0);
          return iVar14;
        }
        pfVar44 = (function_addrs *)((long)pvVar22 + -0x18);
        do {
          pfVar53 = pfVar44 + 1;
          pfVar5 = pfVar44 + 2;
          pfVar44 = pfVar53;
        } while (pc_local == pfVar5->low);
        do {
          if (pc_local < pfVar53->high) {
            function = pfVar53->function;
            filename = *(char **)((long)pvVar18 + 8);
            lineno = *(undefined4 *)((long)pvVar18 + 0x10);
            iVar14 = report_inlined_functions(pc_local,function,callback,data,&filename,&lineno);
            if (iVar14 != 0) {
              return iVar14;
            }
            uVar40 = pfVar53->low;
            pcVar48 = function->name;
            pcVar25 = filename;
            iVar14 = lineno;
            goto LAB_0038a921;
          }
        } while ((pfVar53 != puVar19->u->function_addrs) &&
                (pfVar44 = pfVar53 + -1, puVar7 = &pfVar53->low, pfVar53 = pfVar53 + -1,
                *puVar7 <= pfVar44->low));
      }
      pcVar25 = *(char **)((long)pvVar18 + 8);
      iVar14 = *(int *)((long)pvVar18 + 0x10);
      goto LAB_0038a91e;
    }
    pcVar25 = puVar27->abs_filename;
    if (pcVar25 == (char *)0x0) {
      pcVar48 = puVar27->filename;
      if (pcVar48 == (char *)0x0) {
        pcVar25 = (char *)0x0;
      }
      else {
        pcVar25 = pcVar48;
        if ((*pcVar48 != '/') &&
           (pbVar46 = (backtrace_state *)puVar27->comp_dir, pbVar46 != (backtrace_state *)0x0)) {
          sVar23 = strlen(pcVar48);
          pbVar42 = pbVar46;
          sVar24 = strlen((char *)pbVar46);
          pcVar25 = (char *)backtrace_alloc(pbVar42,sVar24 + sVar23 + 2,error_callback,data);
          if (pcVar25 == (char *)0x0) {
LAB_0038a7ec:
            *found = 0;
            return 0;
          }
          memcpy(pcVar25,pbVar46,sVar24);
          pcVar25[sVar24] = '/';
          memcpy(pcVar25 + sVar24 + 1,pcVar48,sVar23 + 1);
          puVar27 = puVar19->u;
        }
      }
      puVar27->abs_filename = pcVar25;
    }
  }
  iVar14 = 0;
LAB_0038a91e:
  uVar40 = 0;
  pcVar48 = (char *)0x0;
LAB_0038a921:
  iVar14 = (*callback)(data,pc_local,uVar40,pcVar25,iVar14,pcVar48);
  return iVar14;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : (struct unit_addrs*)bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, 0, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, 0, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, fmatch->low, filename, lineno, function->name);
}